

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O1

EverCrypt_Hash_Incremental_state_t *
EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)

{
  undefined8 uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  uint8_t *puVar5;
  Lib_IntVector_Intrinsics_vec256 *palVar6;
  EverCrypt_Hash_state_s *pEVar7;
  EverCrypt_Hash_Incremental_state_t *pEVar8;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_00;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_01;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_02;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_03;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_04;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_05;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_06;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_07;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_08;
  undefined4 extraout_var;
  state_s_tags sVar9;
  undefined7 in_register_00000039;
  byte *__nmemb;
  
  block_len(a);
  uVar3 = block_len(a);
  __nmemb = (byte *)(ulong)uVar3;
  puVar5 = (uint8_t *)calloc((size_t)__nmemb,1);
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    sVar9 = '\x02';
    break;
  case 1:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    sVar9 = '\x03';
    break;
  case 2:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    sVar9 = '\x04';
    break;
  case 3:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    sVar9 = '\x05';
    break;
  case 4:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(5,4);
    sVar9 = '\x01';
    break;
  case 5:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(4,4);
    sVar9 = '\0';
    break;
  case 6:
    _Var2 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var2) {
      sVar9 = '\v';
      palVar6 = (Lib_IntVector_Intrinsics_vec256 *)Hacl_Hash_Blake2s_Simd128_malloc_with_key();
    }
    else {
      palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,4);
      sVar9 = '\n';
    }
    break;
  case 7:
    _Var2 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var2) {
      sVar9 = '\r';
      palVar6 = Hacl_Hash_Blake2b_Simd256_malloc_with_key();
    }
    else {
      palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,8);
      sVar9 = '\f';
    }
    break;
  case 8:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar9 = '\a';
    break;
  case 9:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar9 = '\x06';
    break;
  case 10:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar9 = '\b';
    break;
  case 0xb:
    palVar6 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar9 = '\t';
    break;
  default:
    EverCrypt_Hash_Incremental_malloc_cold_1();
    if ((byte)__nmemb < 0xe) {
      return (EverCrypt_Hash_Incremental_state_t *)
             (ulong)*(uint *)(&DAT_001e5450 + ((ulong)__nmemb & 0xff) * 4);
    }
    block_len_cold_1();
    if (0xd < *__nmemb) {
      init_cold_1();
      pEVar7 = *(EverCrypt_Hash_state_s **)__nmemb;
      uVar1 = *(undefined8 *)(__nmemb + 8);
      alg_of_state(pEVar7);
      iVar4 = init((EVP_PKEY_CTX *)pEVar7);
      *(EverCrypt_Hash_state_s **)__nmemb = pEVar7;
      *(undefined8 *)(__nmemb + 8) = uVar1;
      __nmemb[0x10] = 0;
      __nmemb[0x11] = 0;
      __nmemb[0x12] = 0;
      __nmemb[0x13] = 0;
      __nmemb[0x14] = 0;
      __nmemb[0x15] = 0;
      __nmemb[0x16] = 0;
      __nmemb[0x17] = 0;
      return (EverCrypt_Hash_Incremental_state_t *)CONCAT44(extraout_var,iVar4);
    }
    palVar6 = *(Lib_IntVector_Intrinsics_vec256 **)(__nmemb + 8);
    switch(*__nmemb) {
    case 0:
      Hacl_Hash_MD5_init((uint32_t *)palVar6);
      return extraout_RAX_04;
    case 1:
      Hacl_Hash_SHA1_init((uint32_t *)palVar6);
      return extraout_RAX_05;
    case 2:
      Hacl_Hash_SHA2_sha224_init((uint32_t *)palVar6);
      return extraout_RAX_02;
    case 3:
      Hacl_Hash_SHA2_sha256_init((uint32_t *)palVar6);
      return extraout_RAX_03;
    case 4:
      Hacl_Hash_SHA2_sha384_init((uint64_t *)palVar6);
      return extraout_RAX_00;
    case 5:
      Hacl_Hash_SHA2_sha512_init((uint64_t *)palVar6);
      return extraout_RAX_06;
    default:
      pEVar8 = (EverCrypt_Hash_Incremental_state_t *)memset(palVar6,0,200);
      return pEVar8;
    case 10:
      Hacl_Hash_Blake2s_init((uint32_t *)palVar6,0,0x20);
      return extraout_RAX_08;
    case 0xb:
      Hacl_Hash_Blake2s_Simd128_init((Lib_IntVector_Intrinsics_vec128 *)palVar6,0,0x20);
      return extraout_RAX;
    case 0xc:
      Hacl_Hash_Blake2b_init((uint64_t *)palVar6,0,0x40);
      return extraout_RAX_01;
    case 0xd:
      Hacl_Hash_Blake2b_Simd256_init(palVar6,0,0x40);
      return extraout_RAX_07;
    }
  }
  pEVar7 = (EverCrypt_Hash_state_s *)malloc(0x10);
  pEVar7->tag = sVar9;
  (pEVar7->field_1).case_MD5_s = (uint32_t *)palVar6;
  pEVar8 = (EverCrypt_Hash_Incremental_state_t *)malloc(0x18);
  pEVar8->block_state = pEVar7;
  pEVar8->buf = puVar5;
  pEVar8->total_len = 0;
  init((EVP_PKEY_CTX *)pEVar7);
  return pEVar8;
}

Assistant:

EverCrypt_Hash_Incremental_state_t
*EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)
{
  KRML_CHECK_SIZE(sizeof (uint8_t), block_len(a));
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(block_len(a), sizeof (uint8_t));
  EverCrypt_Hash_state_s *block_state = create_in(a);
  EverCrypt_Hash_Incremental_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  EverCrypt_Hash_Incremental_state_t
  *p =
    (EverCrypt_Hash_Incremental_state_t *)KRML_HOST_MALLOC(sizeof (
        EverCrypt_Hash_Incremental_state_t
      ));
  p[0U] = s;
  init(block_state);
  return p;
}